

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editordetector.cpp
# Opt level: O3

QString * findInPath(QString *__return_storage_ptr__,QString *fileName)

{
  char cVar1;
  long lVar2;
  QString *pQVar3;
  QByteArrayView QVar4;
  QFileInfo fileInfo;
  QStringList paths;
  QString path_;
  QString path;
  QDir local_80 [8];
  QArrayDataPointer<QString> local_78;
  QString local_60;
  QArrayData *local_48 [3];
  
  qgetenv((char *)&local_78);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)&local_60,(QByteArray *)&local_78);
  QVar4.m_data = (storage_type *)local_60.d.d;
  QVar4.m_size = (qsizetype)local_48;
  QString::fromLocal8Bit(QVar4);
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,1,8);
    }
  }
  QString::split(&local_78,local_48,0x3a,0,1);
  if (local_78.size != 0) {
    lVar2 = local_78.size * 0x18;
    pQVar3 = local_78.ptr;
    do {
      QDir::QDir(local_80,pQVar3);
      QDir::filePath(&local_60);
      QDir::~QDir(local_80);
      QFileInfo::QFileInfo((QFileInfo *)local_80,&local_60);
      cVar1 = QFileInfo::exists();
      if (cVar1 != '\0') {
        cVar1 = QFileInfo::isFile();
        if (cVar1 != '\0') {
          cVar1 = QFileInfo::isExecutable();
          if (cVar1 != '\0') {
            QDir::toNativeSeparators(__return_storage_ptr__);
            QFileInfo::~QFileInfo((QFileInfo *)local_80);
            if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
              }
            }
            goto LAB_0012f0ed;
          }
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)local_80);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
        }
      }
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0012f0ed:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QString path_ = QDir(path).filePath(fileName);
        QFileInfo fileInfo(path_);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return QDir::toNativeSeparators(path_);
    }

    return QString();
}